

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSegment.cpp
# Opt level: O0

void __thiscall
vectorgraphics::LineSegment2D::LineSegment2D
          (LineSegment2D *this,double start_x,double start_y,double end_x,double end_y)

{
  double end_y_local;
  double end_x_local;
  double start_y_local;
  double start_x_local;
  LineSegment2D *this_local;
  
  end_y_local = end_x;
  end_x_local = start_y;
  start_y_local = start_x;
  start_x_local = (double)this;
  Primitive::Primitive(&this->super_Primitive);
  std::make_shared<vectorgraphics::Point2D,double&,double&>
            ((double *)&this->start_ptr_,&start_y_local);
  std::make_shared<vectorgraphics::Point2D,double&,double&>((double *)&this->end_ptr_,&end_y_local);
  return;
}

Assistant:

LineSegment2D::LineSegment2D(double start_x, double start_y, double end_x, double end_y) : 
    start_ptr_(std::make_shared<Point2D>(start_x, start_y)), 
    end_ptr_(std::make_shared<Point2D>(end_x, end_y)) {
  }